

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O2

REF_STATUS
ref_iso_cast(REF_GRID_conflict *iso_grid_ptr,REF_DBL **iso_field_ptr,REF_GRID ref_grid,
            REF_DBL *field,REF_INT ldim,REF_DBL *segment0,REF_DBL *segment1)

{
  REF_INT *pRVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_NODE pRVar3;
  REF_GRID_conflict pRVar4;
  REF_CELL pRVar5;
  REF_INT *pRVar6;
  REF_DBL **ppRVar7;
  REF_GRID pRVar8;
  REF_DBL RVar9;
  uint uVar10;
  REF_STATUS RVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  undefined8 uVar16;
  ulong uVar17;
  REF_EDGE pRVar18;
  REF_FACE pRVar19;
  ulong uVar20;
  long lVar21;
  char *pcVar22;
  int iVar23;
  long lVar24;
  REF_DBL RVar25;
  REF_DBL *pRVar26;
  double dVar27;
  void *local_228;
  REF_INT part;
  uint local_200;
  uint local_1fc;
  REF_MPI local_1f8;
  REF_FACE ref_face;
  REF_EDGE ref_edge;
  double local_1e0;
  REF_DBL **local_1d8;
  REF_NODE local_1d0;
  REF_GRID local_1c8;
  REF_DBL *local_1c0;
  REF_GLOB global;
  REF_INT new_cell;
  REF_INT edge_nodes [2];
  REF_INT edges [3];
  REF_DBL tt [2];
  REF_DBL tuvw [4];
  REF_DBL candidate1 [3];
  REF_DBL candidate0 [3];
  REF_DBL triangle2 [3];
  REF_DBL triangle1 [3];
  REF_DBL triangle0 [3];
  REF_INT new_nodes [27];
  
  ref_mpi = ref_grid->mpi;
  pRVar3 = ref_grid->node;
  ref_edge = (REF_EDGE)0x0;
  ref_face = (REF_FACE)0x0;
  uVar10 = ref_node_synchronize_globals(pRVar3);
  if (uVar10 != 0) {
    uVar17 = (ulong)uVar10;
    pcVar22 = "sync glob";
    uVar16 = 0x213;
    goto LAB_001971bf;
  }
  local_1d8 = iso_field_ptr;
  local_1d0 = pRVar3;
  local_1c8 = ref_grid;
  local_1c0 = field;
  uVar10 = ref_grid_create(iso_grid_ptr,ref_mpi);
  pRVar8 = local_1c8;
  if (uVar10 == 0) {
    pRVar4 = *iso_grid_ptr;
    pRVar4->twod = local_1c8->twod;
    local_1f8 = ref_mpi;
    uVar10 = ref_node_initialize_n_global(pRVar4->node,0);
    if (uVar10 == 0) {
      if (pRVar8->twod == 0) {
        uVar10 = ref_face_create(&ref_face,pRVar8);
        pRVar3 = local_1d0;
        pRVar19 = ref_face;
        if (uVar10 == 0) {
          uVar17 = (ulong)ref_face->n;
          if ((long)uVar17 < 0) {
            pcVar22 = "malloc new_node of REF_INT negative";
            uVar16 = 0x23a;
            goto LAB_00197a5a;
          }
          local_228 = malloc(uVar17 * 4);
          if (local_228 == (void *)0x0) {
            pcVar22 = "malloc new_node of REF_INT NULL";
            uVar16 = 0x23a;
            goto LAB_00197a86;
          }
          for (lVar13 = 0; lVar13 < (int)uVar17; lVar13 = lVar13 + 1) {
            *(undefined4 *)((long)local_228 + lVar13 * 4) = 0xffffffff;
            uVar17 = (ulong)(uint)pRVar19->n;
          }
          for (uVar10 = 0; local_200 = uVar10, (int)uVar10 < (int)uVar17; uVar10 = uVar10 + 1) {
            pRVar1 = pRVar19->f2n;
            uVar17 = (ulong)(uVar10 * 4);
            iVar15 = pRVar1[uVar17];
            iVar23 = pRVar1[uVar17 + 1];
            iVar2 = pRVar1[uVar17 + 2];
            pRVar26 = pRVar3->real;
            for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
              *(undefined8 *)((long)triangle0 + lVar13) =
                   *(undefined8 *)((long)pRVar26 + lVar13 + (long)(iVar15 * 0xf) * 8);
              *(undefined8 *)((long)triangle1 + lVar13) =
                   *(undefined8 *)((long)pRVar26 + lVar13 + (long)(iVar23 * 0xf) * 8);
              *(undefined8 *)((long)triangle2 + lVar13) =
                   *(undefined8 *)((long)pRVar26 + lVar13 + (long)(iVar2 * 0xf) * 8);
            }
            RVar11 = ref_iso_triangle_segment(triangle0,triangle1,triangle2,segment0,segment1,tuvw);
            RVar9 = tuvw[0];
            if (RVar11 == 0) {
              dVar27 = tuvw[1];
              if (tuvw[2] <= tuvw[1]) {
                dVar27 = tuvw[2];
              }
              if (tuvw[3] <= dVar27) {
                dVar27 = tuvw[3];
              }
              if (0.0 <= dVar27) {
                dVar27 = 1.0 - tuvw[0];
                RVar25 = tuvw[0];
                if (dVar27 <= tuvw[0]) {
                  RVar25 = dVar27;
                }
                if (0.0 <= RVar25) {
                  local_1e0 = dVar27;
                  uVar12 = ref_face_part(pRVar19,pRVar3,uVar10,&part);
                  if (uVar12 != 0) {
                    uVar17 = (ulong)uVar12;
                    pcVar22 = "face part";
                    uVar16 = 0x24d;
                    goto LAB_001971bc;
                  }
                  if (local_1f8->id == part) {
                    uVar12 = ref_node_next_global(pRVar4->node,&global);
                    if (uVar12 != 0) {
                      uVar17 = (ulong)uVar12;
                      pcVar22 = "next global";
                      uVar16 = 0x250;
                      goto LAB_001971bc;
                    }
                    pRVar1 = (REF_INT *)((long)local_228 + (ulong)uVar10 * 4);
                    uVar12 = ref_node_add(pRVar4->node,global,pRVar1);
                    if (uVar12 != 0) {
                      uVar17 = (ulong)uVar12;
                      pcVar22 = "add node";
                      uVar16 = 0x252;
                      goto LAB_001971bc;
                    }
                    iVar15 = *pRVar1;
                    pRVar26 = pRVar4->node->real;
                    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
                      pRVar26[iVar15 * 0xf + lVar13] =
                           segment1[lVar13] * RVar9 + segment0[lVar13] * local_1e0;
                    }
                  }
                }
              }
            }
            uVar17 = (ulong)(uint)ref_face->n;
            pRVar19 = ref_face;
          }
          goto LAB_001976d7;
        }
        uVar17 = (ulong)uVar10;
        pcVar22 = "create face";
        uVar16 = 0x239;
      }
      else {
        uVar10 = ref_edge_create(&ref_edge,pRVar8);
        pRVar3 = local_1d0;
        pRVar18 = ref_edge;
        if (uVar10 == 0) {
          uVar17 = (ulong)ref_edge->n;
          if ((long)uVar17 < 0) {
            pcVar22 = "malloc new_node of REF_INT negative";
            uVar16 = 0x21c;
            goto LAB_00197a5a;
          }
          local_228 = malloc(uVar17 * 4);
          if (local_228 == (void *)0x0) {
            pcVar22 = "malloc new_node of REF_INT NULL";
            uVar16 = 0x21c;
            goto LAB_00197a86;
          }
          for (lVar13 = 0; lVar13 < (int)uVar17; lVar13 = lVar13 + 1) {
            *(undefined4 *)((long)local_228 + lVar13 * 4) = 0xffffffff;
            uVar17 = (ulong)(uint)pRVar18->n;
          }
          for (uVar10 = 0; local_1fc = uVar10, (int)uVar10 < (int)uVar17; uVar10 = uVar10 + 1) {
            pRVar26 = pRVar3->real;
            iVar15 = pRVar18->e2n[uVar10 * 2];
            iVar23 = pRVar18->e2n[(ulong)uVar10 * 2 + 1];
            for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
              candidate0[lVar13] = pRVar26[iVar15 * 0xf + lVar13];
              candidate1[lVar13] = pRVar26[iVar23 * 0xf + lVar13];
            }
            RVar11 = ref_iso_segment_segment(candidate0,candidate1,segment0,segment1,tt);
            RVar9 = tt[1];
            if (RVar11 == 0) {
              RVar25 = tt[0];
              if (1.0 - tt[0] <= tt[0]) {
                RVar25 = 1.0 - tt[0];
              }
              if (0.0 <= RVar25) {
                dVar27 = 1.0 - tt[1];
                RVar25 = tt[1];
                if (dVar27 <= tt[1]) {
                  RVar25 = dVar27;
                }
                if (0.0 <= RVar25) {
                  local_1e0 = dVar27;
                  uVar12 = ref_edge_part(pRVar18,uVar10,&part);
                  if (uVar12 != 0) {
                    uVar17 = (ulong)uVar12;
                    pcVar22 = "edge part";
                    uVar16 = 0x22c;
                    goto LAB_001971bc;
                  }
                  if (local_1f8->id == part) {
                    uVar12 = ref_node_next_global(pRVar4->node,&global);
                    if (uVar12 != 0) {
                      uVar17 = (ulong)uVar12;
                      pcVar22 = "next global";
                      uVar16 = 0x22f;
                      goto LAB_001971bc;
                    }
                    pRVar1 = (REF_INT *)((long)local_228 + (ulong)uVar10 * 4);
                    uVar12 = ref_node_add(pRVar4->node,global,pRVar1);
                    if (uVar12 != 0) {
                      uVar17 = (ulong)uVar12;
                      pcVar22 = "add node";
                      uVar16 = 0x231;
                      goto LAB_001971bc;
                    }
                    iVar15 = *pRVar1;
                    pRVar26 = pRVar4->node->real;
                    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
                      pRVar26[iVar15 * 0xf + lVar13] =
                           candidate1[lVar13] * local_1e0 + candidate0[lVar13] * RVar9;
                    }
                  }
                }
              }
            }
            uVar17 = (ulong)(uint)ref_edge->n;
            pRVar18 = ref_edge;
          }
LAB_001976d7:
          pRVar8 = local_1c8;
          ppRVar7 = local_1d8;
          if (local_1c0 == (REF_DBL *)0x0) {
            *local_1d8 = (REF_DBL *)0x0;
            if (local_1c8->twod != 0) goto LAB_001978bb;
LAB_00197c0c:
            pRVar5 = local_1c8->cell[8];
            for (iVar15 = 0; iVar15 < pRVar5->max; iVar15 = iVar15 + 1) {
              if (pRVar5->c2n[(long)pRVar5->size_per * (long)iVar15] != -1) {
                iVar23 = 0;
                for (lVar13 = 0; lVar13 < pRVar5->face_per; lVar13 = lVar13 + 1) {
                  pRVar1 = pRVar5->c2n;
                  pRVar6 = pRVar5->f2n;
                  for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
                    edges[lVar24] =
                         pRVar1[(long)pRVar5->size_per * (long)iVar15 +
                                (long)pRVar6[(ulong)((uint)lVar13 & 0x3fffffff) * 4 + lVar24]];
                  }
                  uVar10 = ref_face_with(ref_face,edges,(REF_INT *)&local_200);
                  if (uVar10 != 0) {
                    uVar17 = (ulong)uVar10;
                    pcVar22 = "get face";
                    uVar16 = 0x2b9;
                    goto LAB_001971bc;
                  }
                  if (*(int *)((long)local_228 + (long)(int)local_200 * 4) != -1) {
                    edge_nodes[iVar23] = local_200;
                    iVar23 = iVar23 + 1;
                  }
                }
                if (iVar23 == 2) {
                  new_nodes[0] = *(REF_INT *)((long)local_228 + (long)edge_nodes[0] * 4);
                  new_nodes[1] = *(REF_INT *)((long)local_228 + (long)edge_nodes[1] * 4);
                  new_nodes[2] = 1;
                  uVar10 = ref_cell_add(pRVar4->cell[0],new_nodes,&new_cell);
                  if (uVar10 != 0) {
                    uVar17 = (ulong)uVar10;
                    pcVar22 = "add";
                    uVar16 = 0x2c3;
                    goto LAB_001971bc;
                  }
                }
              }
            }
          }
          else {
            uVar10 = pRVar4->node->max * ldim;
            if ((int)uVar10 < 0) {
              pcVar22 = "malloc *iso_field_ptr of REF_DBL negative";
              uVar16 = 0x261;
LAB_00197a5a:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,uVar16,"ref_iso_cast",pcVar22);
              return 1;
            }
            local_1d8 = (REF_DBL **)malloc((ulong)uVar10 << 3);
            pRVar18 = ref_edge;
            pRVar19 = ref_face;
            *ppRVar7 = (REF_DBL *)local_1d8;
            if (local_1d8 == (REF_DBL **)0x0) {
              pcVar22 = "malloc *iso_field_ptr of REF_DBL NULL";
              uVar16 = 0x261;
              local_1d8 = (REF_DBL **)0x0;
LAB_00197a86:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,uVar16,"ref_iso_cast",pcVar22);
              return 2;
            }
            if (pRVar8->twod == 0) {
              uVar17 = 0;
              uVar20 = 0;
              if (0 < ldim) {
                uVar20 = (ulong)(uint)ldim;
              }
              local_1e0 = (double)CONCAT44(local_1e0._4_4_,ref_face->n);
              for (uVar10 = 0; local_200 = uVar10, (int)uVar10 < local_1e0._0_4_;
                  uVar10 = uVar10 + 1) {
                iVar15 = *(int *)((long)local_228 + (ulong)uVar10 * 4);
                if (iVar15 != -1) {
                  local_1f8 = (REF_MPI)CONCAT44(local_1f8._4_4_,iVar15);
                  pRVar1 = pRVar19->f2n;
                  uVar14 = (ulong)(uVar10 * 4);
                  iVar15 = pRVar1[uVar14];
                  iVar23 = pRVar1[uVar14 + 1];
                  iVar2 = pRVar1[uVar14 + 2];
                  pRVar26 = local_1d0->real;
                  for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
                    *(undefined8 *)((long)triangle0 + lVar13) =
                         *(undefined8 *)((long)pRVar26 + lVar13 + (long)(iVar15 * 0xf) * 8);
                    *(undefined8 *)((long)triangle1 + lVar13) =
                         *(undefined8 *)((long)pRVar26 + lVar13 + (long)(iVar23 * 0xf) * 8);
                    *(undefined8 *)((long)triangle2 + lVar13) =
                         *(undefined8 *)((long)pRVar26 + lVar13 + (long)(iVar2 * 0xf) * 8);
                  }
                  uVar12 = ref_iso_triangle_segment
                                     (triangle0,triangle1,triangle2,segment0,segment1,tuvw);
                  if (uVar12 != 0) {
                    uVar17 = (ulong)uVar12;
                    pcVar22 = "tuvw";
                    uVar16 = 0x287;
                    goto LAB_001971bc;
                  }
                  for (uVar14 = 0; uVar14 != uVar20; uVar14 = uVar14 + 1) {
                    pRVar26 = (REF_DBL *)0x0;
                    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
                      pRVar26 = (REF_DBL *)
                                ((double)pRVar26 +
                                tuvw[lVar13 + 1] *
                                local_1c0[uVar14 + (long)pRVar1[uVar17 + lVar13] * (long)ldim]);
                    }
                    local_1d8[(long)((int)local_1f8 * ldim) + uVar14] = pRVar26;
                  }
                }
                uVar17 = (ulong)((int)uVar17 + 4);
              }
              goto LAB_00197c0c;
            }
            uVar20 = 0;
            uVar17 = 0;
            if (0 < ldim) {
              uVar17 = (ulong)(uint)ldim;
            }
            local_1f8 = (REF_MPI)CONCAT44(local_1f8._4_4_,ref_edge->n);
            while( true ) {
              uVar10 = (uint)uVar20;
              local_1fc = uVar10;
              if ((int)local_1f8 <= (int)uVar10) break;
              iVar15 = *(int *)((long)local_228 + uVar20 * 4);
              if (iVar15 != -1) {
                pRVar26 = local_1d0->real;
                iVar23 = pRVar18->e2n[uVar10 * 2];
                iVar2 = pRVar18->e2n[uVar20 * 2 + 1];
                for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
                  candidate0[lVar13] = pRVar26[iVar23 * 0xf + lVar13];
                  candidate1[lVar13] = pRVar26[iVar2 * 0xf + lVar13];
                }
                uVar12 = ref_iso_segment_segment(candidate0,candidate1,segment0,segment1,tt);
                if (uVar12 != 0) {
                  uVar17 = (ulong)uVar12;
                  pcVar22 = "seg-seg";
                  uVar16 = 0x26f;
                  goto LAB_001971bc;
                }
                for (uVar20 = 0; uVar17 != uVar20; uVar20 = uVar20 + 1) {
                  local_1d8[(long)(iVar15 * ldim) + uVar20] =
                       (REF_DBL *)
                       (local_1c0[(long)(iVar23 * ldim) + uVar20] * (1.0 - tt[1]) +
                       local_1c0[(long)(iVar2 * ldim) + uVar20] * tt[1]);
                }
              }
              uVar20 = (ulong)(uVar10 + 1);
            }
LAB_001978bb:
            pRVar5 = local_1c8->cell[3];
            for (iVar15 = 0; iVar15 < pRVar5->max; iVar15 = iVar15 + 1) {
              if (pRVar5->c2n[(long)pRVar5->size_per * (long)iVar15] != -1) {
                lVar24 = 0;
                iVar23 = 0;
                for (lVar13 = 0; lVar13 < pRVar5->edge_per; lVar13 = lVar13 + 1) {
                  pRVar1 = pRVar5->c2n;
                  iVar2 = pRVar5->size_per;
                  pRVar6 = pRVar5->e2n;
                  for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
                    edge_nodes[lVar21] =
                         pRVar1[(long)*(int *)((long)pRVar6 + lVar21 * 4 + lVar24) +
                                (long)iVar2 * (long)iVar15];
                  }
                  uVar10 = ref_edge_with(ref_edge,edge_nodes[0],edge_nodes[1],(REF_INT *)&local_1fc)
                  ;
                  if (uVar10 != 0) {
                    uVar17 = (ulong)uVar10;
                    pcVar22 = "get edge";
                    uVar16 = 0x2a1;
                    goto LAB_001971bc;
                  }
                  if (*(int *)((long)local_228 + (long)(int)local_1fc * 4) != -1) {
                    edges[iVar23] = local_1fc;
                    iVar23 = iVar23 + 1;
                  }
                  lVar24 = lVar24 + 8;
                }
                if (iVar23 == 2) {
                  new_nodes[0] = *(REF_INT *)((long)local_228 + (long)edges[0] * 4);
                  new_nodes[1] = *(REF_INT *)((long)local_228 + (long)edges[1] * 4);
                  new_nodes[2] = 1;
                  uVar10 = ref_cell_add(pRVar4->cell[0],new_nodes,&new_cell);
                  if (uVar10 != 0) {
                    uVar17 = (ulong)uVar10;
                    pcVar22 = "add";
                    uVar16 = 0x2ab;
                    goto LAB_001971bc;
                  }
                }
              }
            }
          }
          if ((ref_face == (REF_FACE)0x0) || (uVar10 = ref_face_free(ref_face), uVar10 == 0)) {
            if ((ref_edge == (REF_EDGE)0x0) || (uVar10 = ref_edge_free(ref_edge), uVar10 == 0)) {
              free(local_228);
              return 0;
            }
            uVar17 = (ulong)uVar10;
            pcVar22 = "free";
            uVar16 = 0x2cc;
          }
          else {
            uVar17 = (ulong)uVar10;
            pcVar22 = "free";
            uVar16 = 0x2c9;
          }
        }
        else {
          uVar17 = (ulong)uVar10;
          pcVar22 = "create edge";
          uVar16 = 0x21b;
        }
      }
    }
    else {
      uVar17 = (ulong)uVar10;
      pcVar22 = "zero glob";
      uVar16 = 0x218;
    }
  }
  else {
    uVar17 = (ulong)uVar10;
    pcVar22 = "create";
    uVar16 = 0x215;
  }
LAB_001971bc:
  uVar10 = (uint)uVar17;
LAB_001971bf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar16,
         "ref_iso_cast",uVar17,pcVar22);
  return uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_iso_cast(REF_GRID *iso_grid_ptr, REF_DBL **iso_field_ptr,
                                REF_GRID ref_grid, REF_DBL *field, REF_INT ldim,
                                REF_DBL *segment0, REF_DBL *segment1) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = NULL;
  REF_GRID iso_grid;
  REF_EDGE ref_edge = NULL;
  REF_FACE ref_face = NULL;
  REF_INT edge, face, i, j, part, cell;
  REF_GLOB global;
  REF_INT *new_node = NULL;
  REF_DBL candidate0[3], candidate1[3];
  REF_DBL triangle0[3], triangle1[3], triangle2[3];
  REF_DBL tt[2], ss[2], tuvw[4];
  REF_DBL inside = 0.0;
  REF_DBL t0, t1;
  REF_INT id = 1;
  REF_DBL *iso_field;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  ref_grid_twod(iso_grid) = ref_grid_twod(ref_grid);
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
    ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
    each_ref_edge(ref_edge, edge) {
      for (i = 0; i < 3; i++) {
        candidate0[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
        candidate1[i] =
            ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
      }
      if (REF_SUCCESS != ref_iso_segment_segment(candidate0, candidate1,
                                                 segment0, segment1, tt))
        continue;
      ss[0] = 1.0 - tt[0];
      ss[1] = 1.0 - tt[1];
      if (MIN(tt[0], ss[0]) < inside) continue;
      if (MIN(tt[1], ss[1]) < inside) continue;

      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[edge]) =
              ss[1] * candidate1[i] + tt[1] * candidate0[i];
        }
      }
    }
  } else {
    RSS(ref_face_create(&ref_face, ref_grid), "create face");
    ref_malloc_init(new_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

    each_ref_face(ref_face, face) {
      for (i = 0; i < 3; i++) {
        triangle0[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
        triangle1[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
        triangle2[i] =
            ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
      }
      if (REF_SUCCESS != ref_iso_triangle_segment(triangle0, triangle1,
                                                  triangle2, segment0, segment1,
                                                  tuvw))
        continue;
      if (MIN(MIN(tuvw[1], tuvw[2]), tuvw[3]) < inside) continue;
      /* exclude intersections outside of segment */
      if (MIN(tuvw[0], 1.0 - tuvw[0]) < inside) continue;

      RSS(ref_face_part(ref_face, ref_node, face, &part), "face part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[face])),
            "add node");
        t1 = tuvw[0];
        t0 = 1.0 - t1;
        for (i = 0; i < 3; i++) {
          ref_node_xyz(ref_grid_node(iso_grid), i, new_node[face]) =
              t1 * segment1[i] + t0 * segment0[i];
        }
      }
    }
  }
  if (NULL == field) {
    *iso_field_ptr = NULL;
  } else {
    REF_INT node;
    ref_malloc(*iso_field_ptr, ldim * ref_node_max(ref_grid_node(iso_grid)),
               REF_DBL);
    iso_field = *iso_field_ptr;
    if (ref_grid_twod(ref_grid)) {
      each_ref_edge(ref_edge, edge) {
        node = new_node[edge];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            candidate0[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 0, edge));
            candidate1[i] =
                ref_node_xyz(ref_node, i, ref_edge_e2n(ref_edge, 1, edge));
          }
          RSS(ref_iso_segment_segment(candidate0, candidate1, segment0,
                                      segment1, tt),
              "seg-seg");
          ss[0] = 1.0 - tt[0];
          ss[1] = 1.0 - tt[1];
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] =
                ss[1] * field[j + ldim * ref_edge_e2n(ref_edge, 0, edge)] +
                tt[1] * field[j + ldim * ref_edge_e2n(ref_edge, 1, edge)];
          }
        }
      }
    } else {
      each_ref_face(ref_face, face) {
        node = new_node[face];
        if (REF_EMPTY != node) {
          for (i = 0; i < 3; i++) {
            triangle0[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 0, face));
            triangle1[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 1, face));
            triangle2[i] =
                ref_node_xyz(ref_node, i, ref_face_f2n(ref_face, 2, face));
          }
          RSS(ref_iso_triangle_segment(triangle0, triangle1, triangle2,
                                       segment0, segment1, tuvw),
              "tuvw");
          for (j = 0; j < ldim; j++) {
            iso_field[j + ldim * node] = 0.0;
            for (i = 0; i < 3; i++) {
              iso_field[j + ldim * node] +=
                  tuvw[i + 1] *
                  field[j + ldim * ref_face_f2n(ref_face, i, face)];
            }
          }
        }
      }
    }
  }

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_edge, node, edge_nodes[2];
      REF_INT nedge, edges[3];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        for (node = 0; node < 2; node++) {
          edge_nodes[node] = ref_cell_e2n(ref_cell, node, cell_edge, cell);
        }
        RSS(ref_edge_with(ref_edge, edge_nodes[0], edge_nodes[1], &edge),
            "get edge");
        if (REF_EMPTY != new_node[edge]) {
          edges[nedge] = edge;
          nedge++;
        }
      }
      if (2 == nedge) {
        new_nodes[0] = new_node[edges[0]];
        new_nodes[1] = new_node[edges[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell(ref_cell, cell) {
      REF_INT cell_face, node, face_nodes[4];
      REF_INT nface, faces[4];
      REF_INT new_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
      nface = 0;
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, face_nodes, &face), "get face");
        if (REF_EMPTY != new_node[face]) {
          faces[nface] = face;
          nface++;
        }
      }
      if (2 == nface) {
        new_nodes[0] = new_node[faces[0]];
        new_nodes[1] = new_node[faces[1]];
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  }

  if (NULL != ref_face) {
    RSS(ref_face_free(ref_face), "free");
  }
  if (NULL != ref_edge) {
    RSS(ref_edge_free(ref_edge), "free");
  }
  ref_free(new_node);
  return REF_SUCCESS;
}